

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_868a0::data<float>::checkValues
          (data<float> *this,vector<float,_std::allocator<float>_> *data,Box2i *dw,
          bool dontbothercheckingdepth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  pointer pvVar7;
  undefined7 in_register_00000009;
  pointer pfVar8;
  long lVar9;
  long lVar10;
  pointer pbVar11;
  long lVar12;
  float fVar13;
  
  iVar4 = (dw->min).y;
  iVar1 = (dw->max).x;
  iVar2 = (dw->min).x;
  iVar3 = (dw->max).y;
  lVar5 = (long)(((iVar3 - iVar4) + 1) * ((iVar1 - iVar2) + 1));
  if (iVar3 < iVar4) {
    lVar5 = 1;
  }
  pbVar11 = (this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (iVar1 < iVar2) {
    lVar5 = 1;
  }
  lVar5 = ((long)(this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) + lVar5;
  if ((int)CONCAT71(in_register_00000009,dontbothercheckingdepth) == 0) {
    if (lVar5 != 0) {
      pvVar7 = (this->_results).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar8 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      lVar12 = 0;
      lVar9 = 0;
      do {
        fVar13 = ABS(*(float *)(*(long *)&pvVar7[lVar9].
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data + lVar12 * 4) - pfVar8[lVar10]);
        if (0.005 < fVar13) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sample ",7);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," (channel ",10);
          pbVar11 = (this->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,pbVar11[lVar12]._M_dataplus._M_p,
                              pbVar11[lVar12]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," of pixel ",10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"doesn\'t match expected value (channel ",0x26);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," of pixel ",10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") : ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"got ",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((double)(data->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_start[lVar10]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," expected ",10);
          poVar6 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&(this->_results).
                                                                                                                      
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar12 * 4));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pvVar7 = (this->_results).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pfVar8 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          fVar13 = ABS(*(float *)(*(long *)&pvVar7[lVar9].
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data + lVar12 * 4) -
                       pfVar8[lVar10]);
        }
        if (0.005 < fVar13) {
          __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                        ,0x17e,
                        "void (anonymous namespace)::data<float>::checkValues(const vector<T> &, const Box2i &, bool) [T = float]"
                       );
        }
        lVar12 = lVar12 + 1;
        if (lVar12 == (long)(this->_channels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_channels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) {
          lVar9 = lVar9 + 1;
          if (lVar9 == ((long)(this->_results).
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
                       -0x5555555555555555) {
            lVar9 = 0;
          }
          lVar12 = 0;
        }
        lVar10 = lVar10 + 1;
      } while (lVar5 != lVar10);
    }
  }
  else if (lVar5 != 0) {
    lVar10 = 0;
    lVar9 = 0;
    lVar12 = 0;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar11 + lVar9));
      if ((iVar4 != 0) &&
         (iVar4 = std::__cxx11::string::compare
                            ((char *)((this->_channels).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar9)),
         iVar4 != 0)) {
        fVar13 = ABS(*(float *)(*(long *)&(this->_results).
                                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar12].
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data + lVar9 * 4) -
                     (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar10]);
        if (0.005 < fVar13) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sample ",7);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," (channel ",10);
          pbVar11 = (this->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,pbVar11[lVar9]._M_dataplus._M_p,pbVar11[lVar9]._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," of pixel ",10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"doesn\'t match expected value (channel ",0x26);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," of pixel ",10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") : ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"got ",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((double)(data->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_start[lVar10]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," expected ",10);
          poVar6 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&(this->_results).
                                                                                                                      
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar12].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar9 * 4));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          fVar13 = ABS(*(float *)(*(long *)&(this->_results).
                                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar12].
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data + lVar9 * 4) -
                       (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar10]);
        }
        if (0.005 < fVar13) {
          __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                        ,0x166,
                        "void (anonymous namespace)::data<float>::checkValues(const vector<T> &, const Box2i &, bool) [T = float]"
                       );
        }
      }
      lVar9 = lVar9 + 1;
      pbVar11 = (this->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (lVar9 == (long)(this->_channels).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) {
        lVar12 = lVar12 + 1;
        if (lVar12 == ((long)(this->_results).
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_results).
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
        {
          lVar12 = 0;
        }
        lVar9 = 0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar5 != lVar10);
  }
  return;
}

Assistant:

void checkValues (
        const vector<T>& data, const Box2i& dw, bool dontbothercheckingdepth)
    {
        size_t size =
            _channels.size () + (dw.size ().x + 1) * (dw.size ().y + 1);
        size_t pel     = 0;
        size_t channel = 0;
        if (dontbothercheckingdepth)
        {
            for (size_t i = 0; i < size; i++)
            {
                if (_channels[channel] != "Z" && _channels[channel] != "ZBack")
                {
                    if (fabs (_results[pel][channel] - data[i]) > 0.005)
                    {
                        cout << "sample " << i << " (channel "
                             << _channels[channel] << " of pixel "
                             << i % _channels.size () << ") ";
                        cout << "doesn't match expected value (channel "
                             << channel << " of pixel " << pel << ") : ";
                        cout << "got " << data[i] << " expected "
                             << _results[pel][channel] << endl;
                    }
                    assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                }
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
        else
        {
            for (size_t i = 0; i < size; i++)
            {
                if (fabs (_results[pel][channel] - data[i]) > 0.005)
                {
                    cout << "sample " << i << " (channel " << _channels[channel]
                         << " of pixel " << i % _channels.size () << ") ";
                    cout << "doesn't match expected value (channel " << channel
                         << " of pixel " << pel << ") : ";
                    cout << "got " << data[i] << " expected "
                         << _results[pel][channel] << endl;
                }
                assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
    }